

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeReturn(TranslateToFuzzReader *this,Type type)

{
  Expression *pEVar1;
  Expression *pEVar2;
  ulong extraout_RDX;
  Type type_00;
  
  ::wasm::HeapType::getSignature();
  if (extraout_RDX < 2) {
    pEVar1 = (Expression *)0x0;
  }
  else {
    ::wasm::HeapType::getSignature();
    pEVar1 = make(this,type_00);
  }
  pEVar2 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x18,8);
  pEVar2->_id = ReturnId;
  (pEVar2->type).id = 0;
  *(undefined8 *)(pEVar2 + 1) = 0;
  (pEVar2->type).id = 1;
  *(Expression **)(pEVar2 + 1) = pEVar1;
  return pEVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeReturn(Type type) {
  return builder.makeReturn(funcContext->func->getResults().isConcrete()
                              ? make(funcContext->func->getResults())
                              : nullptr);
}